

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnd.h
# Opt level: O3

int rnl(int x)

{
  short sVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  
  uVar2 = mt_random();
  uVar2 = uVar2 % (uint)x;
  lVar6 = (long)u.uluck;
  lVar5 = (long)u.moreluck;
  if (((int)(lVar5 + lVar6) != 0) &&
     (uVar3 = mt_random(), SUB168(ZEXT416(uVar3) % SEXT816(0x32 - (lVar5 + lVar6)),0) != 0)) {
    iVar4 = (int)u.moreluck + (int)u.uluck;
    if (-6 < iVar4) {
      sVar1 = (short)((uint)(iVar4 * 0x5556) >> 0x10);
      iVar4 = (int)(short)(sVar1 - (sVar1 >> 0xf));
    }
    uVar2 = uVar2 - iVar4;
    if ((int)uVar2 < 0) {
      uVar2 = 0;
    }
    else if (x <= (int)uVar2) {
      uVar2 = x - 1;
    }
  }
  return uVar2;
}

Assistant:

static inline int rnl(int x)
{
	int i;

	i = RND(x);

	if (Luck && rn2(50 - Luck)) {
	    i -= (x <= 15 && Luck >= -5 ? Luck/3 : Luck);
	    if (i < 0) i = 0;
	    else if (i >= x) i = x-1;
	}

	return i;
}